

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O1

int Hsh_IntManAdd(Hsh_IntMan_t *p,int iData)

{
  byte *pbVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Wrd_t *pVVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int *piVar13;
  word *pwVar14;
  int iVar15;
  uint uVar16;
  long lVar18;
  ulong uVar19;
  uint *puVar20;
  uchar *pDataC;
  ulong uVar17;
  
  pVVar3 = p->vTable;
  if (pVVar3->nSize < p->vObjs->nSize) {
    uVar19 = (ulong)(pVVar3->nSize * 2 - 1);
    while( true ) {
      do {
        uVar11 = (uint)uVar19;
        uVar16 = uVar11 + 1;
        uVar17 = (ulong)uVar16;
        uVar7 = uVar19 & 1;
        uVar19 = uVar17;
      } while (uVar7 != 0);
      if (uVar16 < 9) break;
      iVar15 = 5;
      while (uVar16 % (iVar15 - 2U) != 0) {
        uVar10 = iVar15 * iVar15;
        iVar15 = iVar15 + 2;
        if (uVar16 < uVar10) goto LAB_00565fcd;
      }
    }
LAB_00565fcd:
    if (pVVar3->nCap < (int)uVar16) {
      if (pVVar3->pArray == (int *)0x0) {
        piVar13 = (int *)malloc((long)(int)uVar16 << 2);
      }
      else {
        piVar13 = (int *)realloc(pVVar3->pArray,(long)(int)uVar16 << 2);
      }
      pVVar3->pArray = piVar13;
      if (piVar13 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar3->nCap = uVar16;
    }
    if (uVar11 < 0x7fffffff) {
      memset(pVVar3->pArray,0xff,uVar17 << 2);
    }
    pVVar3->nSize = uVar16;
    pVVar4 = p->vObjs;
    if (0 < pVVar4->nSize) {
      pVVar3 = p->vData;
      pVVar5 = p->vTable;
      pwVar14 = pVVar4->pArray;
      lVar18 = 0;
      do {
        uVar11 = p->nSize;
        uVar16 = (int)pwVar14[lVar18] * uVar11;
        if (((int)uVar16 < 0) || (pVVar3->nSize <= (int)uVar16)) goto LAB_00566323;
        if ((uVar11 & 0x3fffffff) == 0) {
          uVar10 = 0;
        }
        else {
          uVar19 = 0;
          uVar10 = 0;
          do {
            lVar8 = uVar19 + (ulong)uVar16 * 4;
            uVar19 = uVar19 + 1;
            uVar10 = (*(byte *)((long)pVVar3->pArray + lVar8) + uVar10) * 0x401;
            uVar10 = uVar10 >> 6 ^ uVar10;
          } while (uVar11 << 2 != uVar19);
          uVar10 = uVar10 * 9;
        }
        uVar11 = pVVar5->nSize;
        uVar19 = (ulong)((uVar10 >> 0xb ^ uVar10) * 0x8001) % (ulong)uVar11;
        if (((int)uVar19 < 0) || ((int)uVar11 <= (int)uVar19)) goto LAB_00566323;
        piVar13 = pVVar5->pArray;
        *(int *)((long)pwVar14 + lVar18 * 8 + 4) = piVar13[uVar19];
        piVar13[uVar19] = (int)lVar18;
        lVar18 = lVar18 + 1;
      } while (lVar18 < pVVar4->nSize);
    }
  }
  iVar15 = p->nSize;
  uVar11 = iVar15 * iData;
  if (-1 < (int)uVar11) {
    iVar2 = p->vData->nSize;
    if ((int)uVar11 < iVar2) {
      piVar6 = p->vData->pArray;
      piVar13 = piVar6 + uVar11;
      uVar11 = p->vTable->nSize;
      if (iVar15 * 4 == 0) {
        uVar16 = 0;
      }
      else {
        uVar19 = 0;
        uVar16 = 0;
        do {
          pbVar1 = (byte *)((long)piVar13 + uVar19);
          uVar19 = uVar19 + 1;
          uVar16 = (*pbVar1 + uVar16) * 0x401;
          uVar16 = uVar16 >> 6 ^ uVar16;
        } while ((uint)(iVar15 * 4) != uVar19);
        uVar16 = uVar16 * 9;
      }
      uVar19 = (ulong)((uVar16 >> 0xb ^ uVar16) * 0x8001) % (ulong)uVar11;
      iVar12 = (int)uVar19;
      if ((-1 < iVar12) && (iVar12 < (int)uVar11)) {
        puVar9 = (uint *)(p->vTable->pArray + uVar19);
        do {
          puVar20 = puVar9;
          uVar11 = *puVar20;
          uVar19 = (ulong)uVar11;
          if (uVar19 == 0xffffffff) {
            pwVar14 = (word *)0x0;
          }
          else {
            if (((int)uVar11 < 0) || (p->vObjs->nSize <= (int)uVar11)) goto LAB_00566342;
            pwVar14 = p->vObjs->pArray + uVar19;
          }
          if (pwVar14 == (word *)0x0) {
            if (uVar11 != 0xffffffff) {
              __assert_fail("*pPlace == -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecHsh.h"
                            ,0x138,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
            }
            goto LAB_0056625c;
          }
          uVar16 = (int)*pwVar14 * iVar15;
          if (((int)uVar16 < 0) || (iVar2 <= (int)uVar16)) goto LAB_00566323;
          iVar12 = bcmp(piVar13,piVar6 + uVar16,(long)iVar15 * 4);
          puVar9 = (uint *)((long)pwVar14 + 4);
        } while (iVar12 != 0);
        if (uVar11 != 0xffffffff) {
          if ((-1 < (int)uVar11) && ((int)uVar11 < p->vObjs->nSize)) {
            return (int)((long)p->vObjs->pArray + (uVar19 * 8 - (long)p->vObjs->pArray) >> 3);
          }
LAB_00566342:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
LAB_0056625c:
        pVVar4 = p->vObjs;
        *puVar20 = pVVar4->nSize;
        uVar11 = pVVar4->nCap;
        if (pVVar4->nSize == uVar11) {
          if ((int)uVar11 < 0x10) {
            if (pVVar4->pArray == (word *)0x0) {
              pwVar14 = (word *)malloc(0x80);
            }
            else {
              pwVar14 = (word *)realloc(pVVar4->pArray,0x80);
            }
            pVVar4->pArray = pwVar14;
            iVar15 = 0x10;
          }
          else {
            iVar15 = uVar11 * 2;
            if (iVar15 <= (int)uVar11) goto LAB_005662e5;
            if (pVVar4->pArray == (word *)0x0) {
              pwVar14 = (word *)malloc((ulong)uVar11 << 4);
            }
            else {
              pwVar14 = (word *)realloc(pVVar4->pArray,(ulong)uVar11 << 4);
            }
            pVVar4->pArray = pwVar14;
          }
          if (pwVar14 == (word *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                          ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
          pVVar4->nCap = iVar15;
        }
LAB_005662e5:
        iVar15 = pVVar4->nSize;
        pVVar4->nSize = iVar15 + 1;
        pVVar4->pArray[iVar15] = (ulong)(uint)iData | 0xffffffff00000000;
        return p->vObjs->nSize + -1;
      }
    }
  }
LAB_00566323:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

static inline int Hsh_IntManAdd( Hsh_IntMan_t * p, int iData )
{
    int i, * pPlace;
    if ( Vec_WrdSize(p->vObjs) > Vec_IntSize(p->vTable) )
    {
        Vec_IntFill( p->vTable, Abc_PrimeCudd(2*Vec_IntSize(p->vTable)), -1 );
        for ( i = 0; i < Vec_WrdSize(p->vObjs); i++ )
        {
            pPlace = Vec_IntEntryP( p->vTable, Hsh_IntManHash(Hsh_IntData(p, Hsh_IntObj(p, i)->iData), p->nSize, Vec_IntSize(p->vTable)) );
            Hsh_IntObj(p, i)->iNext = *pPlace;  *pPlace = i;
        }
    }
    pPlace = Hsh_IntManLookup( p, Hsh_IntData(p, iData) );
    if ( *pPlace == -1 )
    {
        *pPlace = Vec_WrdSize(p->vObjs);
        Vec_WrdPush( p->vObjs, Hsh_IntWord(iData, -1) );
        return Vec_WrdSize(p->vObjs) - 1;
    }
    return (word *)Hsh_IntObj(p, *pPlace) - Vec_WrdArray(p->vObjs);
}